

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O0

void __thiscall btMatrixX<float>::resize(btMatrixX<float> *this,int rows,int cols)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  CProfileSample *in_RDI;
  CProfileSample __profile;
  char *in_stack_ffffffffffffffc8;
  float *in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffec;
  
  *(int *)(in_RDI + 0xc) = *(int *)(in_RDI + 0xc) + 1;
  *(undefined4 *)in_RDI = in_ESI;
  *(undefined4 *)(in_RDI + 4) = in_EDX;
  CProfileSample::CProfileSample(in_RDI,in_stack_ffffffffffffffc8);
  btAlignedObjectArray<float>::resize
            ((btAlignedObjectArray<float> *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec,
             in_stack_ffffffffffffffe0);
  CProfileSample::~CProfileSample((CProfileSample *)0x2636d3);
  return;
}

Assistant:

void resize(int rows, int cols)
	{
		m_resizeOperations++;
		m_rows = rows;
		m_cols = cols;
		{
			BT_PROFILE("m_storage.resize");
			m_storage.resize(rows*cols);
		}
	}